

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O2

int __thiscall ktxUpgrader::main(ktxUpgrader *this,int argc,char **argv)

{
  size_type sVar1;
  ktxTexture1 *pkVar2;
  undefined8 uVar3;
  int iVar4;
  FILE *pFVar5;
  ulong uVar6;
  ostream *poVar7;
  int *piVar8;
  ktxHashList pkVar9;
  char *pcVar10;
  char cVar11;
  pointer pbVar12;
  bool bVar13;
  int local_274;
  FILE *local_270;
  ktxTexture1 *texture;
  allocator<char> local_259;
  string *local_258;
  string *local_250;
  FILE *local_248;
  uint orientLen;
  string outfile;
  char *orientation;
  undefined8 local_210;
  uint keyLen;
  string infile;
  char answer;
  undefined7 uStack_1b7;
  ostream local_1a8 [376];
  
  texture = (ktxTexture1 *)0x0;
  local_270 = (FILE *)0x0;
  ktxApp::processCommandLine(&this->super_ktxApp,argc,argv,eAllowStdin,eNone);
  (*(this->super_ktxApp)._vptr_ktxApp[4])(this);
  pbVar12 = (this->options).super_commandOptions.infiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_250 = (string *)&(this->options).super_commandOptions.outfile;
  local_258 = (string *)&(this->super_ktxApp).name;
  local_274 = 0;
  do {
    if ((this->options).super_commandOptions.infiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= pbVar12) {
      return local_274;
    }
    std::__cxx11::string::string((string *)&infile,(string *)pbVar12);
    outfile._M_dataplus._M_p = (pointer)&outfile.field_2;
    outfile._M_string_length = 0;
    outfile.field_2._M_local_buf[0] = '\0';
    iVar4 = std::__cxx11::string::compare((char *)&infile);
    pFVar5 = _stdin;
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&answer,"rb",(allocator<char> *)&orientation);
      pFVar5 = fopen(infile._M_dataplus._M_p,(char *)CONCAT71(uStack_1b7,answer));
      std::__cxx11::string::~string((string *)&answer);
    }
    local_248 = pFVar5;
    if (pFVar5 == (FILE *)0x0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,local_258);
      poVar7 = std::operator<<(poVar7," could not open input file \"");
      iVar4 = std::__cxx11::string::compare((char *)&infile);
      if (iVar4 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&answer,"stdin",&local_259);
      }
      else {
        std::__cxx11::string::string((string *)&answer,(string *)&infile);
      }
      poVar7 = std::operator<<(poVar7,(string *)&answer);
      poVar7 = std::operator<<(poVar7,"\". ");
      piVar8 = __errno_location();
      pcVar10 = strerror(*piVar8);
      poVar7 = std::operator<<(poVar7,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&answer);
LAB_001060c1:
      bVar13 = false;
      local_274 = 2;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&infile);
      sVar1 = (this->options).super_commandOptions.outfile._M_string_length;
      if ((iVar4 == 0) || (sVar1 != 0 || (this->options).super_commandOptions.field_0x44 != '\0')) {
        if (sVar1 != 0) {
          std::__cxx11::string::_M_assign((string *)&outfile);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&outfile);
        uVar6 = std::__cxx11::string::rfind((char)&outfile,0x2e);
        if (uVar6 != 0xffffffffffffffff) {
          std::__cxx11::string::erase((ulong)&outfile,uVar6);
        }
        std::__cxx11::string::append((char *)&outfile);
      }
      if ((this->options).super_commandOptions.field_0x44 == '\x01') {
        local_270 = _stdout;
      }
      else if (outfile._M_string_length != 0) {
        local_270 = (FILE *)ktxApp::fopen_write_if_not_exists(&outfile);
      }
      if (local_270 == (FILE *)0x0) {
        piVar8 = __errno_location();
        if (*piVar8 == 0x11) {
          cVar11 = (this->options).super_commandOptions.field_0x45;
          if (cVar11 == '\0') {
            iVar4 = fileno(_stdin);
            iVar4 = isatty(iVar4);
            if (iVar4 != 0) {
              poVar7 = std::operator<<((ostream *)&std::cout,"Output file ");
              poVar7 = std::operator<<(poVar7,local_250);
              std::operator<<(poVar7," exists. Overwrite? [Y or n] ");
              std::operator>>((istream *)&std::cin,&answer);
              if (answer == 'Y') {
                cVar11 = '\x01';
              }
            }
          }
          if (cVar11 != '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&answer,"wb",(allocator<char> *)&orientation);
            local_270 = fopen(outfile._M_dataplus._M_p,(char *)CONCAT71(uStack_1b7,answer));
            std::__cxx11::string::~string((string *)&answer);
            if (local_270 != (FILE *)0x0) goto LAB_00105b89;
          }
        }
        poVar7 = std::operator<<((ostream *)&std::cerr,local_258);
        poVar7 = std::operator<<(poVar7," could not open output file \"");
        pcVar10 = "stdout";
        if ((this->options).super_commandOptions.outfile._M_string_length != 0) {
          pcVar10 = (this->options).super_commandOptions.outfile._M_dataplus._M_p;
        }
        poVar7 = std::operator<<(poVar7,pcVar10);
        poVar7 = std::operator<<(poVar7,"\". ");
        pcVar10 = strerror(*piVar8);
        poVar7 = std::operator<<(poVar7,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar7);
        local_270 = (FILE *)0x0;
        local_274 = 2;
        bVar13 = false;
      }
      else {
LAB_00105b89:
        iVar4 = ktxTexture1_CreateFromStdioStream(local_248,1,&texture);
        if (iVar4 != 0) {
          if (iVar4 == 0xf) {
            poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&infile);
            poVar7 = std::operator<<(poVar7," is not a KTX v1 file.");
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,local_258);
            poVar7 = std::operator<<(poVar7," failed to create ktxTexture from ");
            poVar7 = std::operator<<(poVar7,(string *)&infile);
            poVar7 = std::operator<<(poVar7,": ");
            pcVar10 = (char *)ktxErrorString(iVar4);
            poVar7 = std::operator<<(poVar7,pcVar10);
          }
          std::endl<char,std::char_traits<char>>(poVar7);
          fclose(local_248);
          fclose(local_270);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&answer,*(char **)local_250,(allocator<char> *)&orientation);
          unlink((char *)CONCAT71(uStack_1b7,answer));
          std::__cxx11::string::~string((string *)&answer);
          goto LAB_001060c1;
        }
        for (pkVar9 = texture->kvDataHead; pkVar9 != (ktxHashList)0x0;
            pkVar9 = (ktxHashList)ktxHashList_Next(pkVar9)) {
          ktxHashListEntry_GetKey(pkVar9,&keyLen,&answer);
          pcVar10 = (char *)CONCAT71(uStack_1b7,answer);
          iVar4 = strncasecmp(pcVar10,"KTX",3);
          if (((iVar4 == 0) && (iVar4 = strcmp(pcVar10,"KTXorientation"), iVar4 != 0)) &&
             (iVar4 = strcmp(pcVar10,"KTXwriter"), iVar4 != 0)) {
            iVar4 = strcmp(pcVar10,"KTXOrientation");
            if ((iVar4 == 0) && ((this->options).super_commandOptions.field_0x46 == '\x01')) {
              ktxHashListEntry_GetValue(pkVar9,&orientLen,&orientation);
              ktxHashList_AddKVPair(&texture->kvDataHead,"KTXorientation",orientLen,orientation);
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,local_258);
              poVar7 = std::operator<<(poVar7,": Warning: Dropping unrecognized ");
              poVar7 = std::operator<<(poVar7,"metadata \"");
              poVar7 = std::operator<<(poVar7,(char *)CONCAT71(uStack_1b7,answer));
              poVar7 = std::operator<<(poVar7,"\"");
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            ktxHashList_DeleteEntry(&texture->kvDataHead,pkVar9);
          }
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&answer);
        ktxApp::writeId(&this->super_ktxApp,local_1a8,(this->options).super_commandOptions.test != 0
                       );
        pkVar2 = texture;
        std::__cxx11::stringbuf::str();
        uVar3 = local_210;
        std::__cxx11::stringbuf::str();
        ktxHashList_AddKVPair(&pkVar2->kvDataHead,"KTXwriter",(int)uVar3 + 1,_keyLen);
        std::__cxx11::string::~string((string *)&keyLen);
        std::__cxx11::string::~string((string *)&orientation);
        iVar4 = ktxTexture1_WriteKTX2ToStdioStream(texture,local_270);
        (*texture->vtbl->Destroy)((ktxTexture *)texture);
        fclose(local_248);
        fclose(local_270);
        bVar13 = iVar4 == 0;
        if (!bVar13) {
          poVar7 = std::operator<<((ostream *)&std::cerr,local_258);
          poVar7 = std::operator<<(poVar7," failed to write KTX2 file; ");
          pcVar10 = (char *)ktxErrorString(iVar4);
          poVar7 = std::operator<<(poVar7,pcVar10);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&orientation,*(char **)local_250,(allocator<char> *)&keyLen);
          unlink(orientation);
          std::__cxx11::string::~string((string *)&orientation);
          local_274 = 2;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&answer);
      }
    }
    std::__cxx11::string::~string((string *)&outfile);
    std::__cxx11::string::~string((string *)&infile);
    pbVar12 = pbVar12 + 1;
    if (!bVar13) {
      return local_274;
    }
  } while( true );
}

Assistant:

int
ktxUpgrader::main(int argc, char* argv[])
{
    FILE *inf, *outf = nullptr;
    KTX_error_code result;
    ktxTexture1* texture = 0;
    int exitCode = 0;

    processCommandLine(argc, argv);
    validateOptions();

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
       string infile = *it;
       string outfile;

        if (infile.compare("-") == 0) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            if (infile.compare("-")
                && !options.useStdout && !options.outfile.length())
            {
                size_t dot;

                outfile = infile;
                dot = outfile.find_last_of('.');
                if (dot !=string::npos) {
                    outfile.erase(dot,string::npos);
                }
                outfile += ".ktx2";
            } else if (options.outfile.length()) {
                outfile = options.outfile;
            }

            if (options.useStdout) {
                outf = stdout;
#if defined(_WIN32)
                /* Set "stdout" to have binary mode */
                (void)_setmode( _fileno( stdout ), _O_BINARY );
#endif
            } else if (outfile.length()) {
                outf = fopen_write_if_not_exists(outfile);
            }

            if (!outf && errno == EEXIST) {
                bool force = options.force;
                if (!force) {
                    if (isatty(fileno(stdin))) {
                        char answer;
                        cout << "Output file " << options.outfile
                             << " exists. Overwrite? [Y or n] ";
                        cin >> answer;
                        if (answer == 'Y') {
                            force = true;
                        }
                    }
                }
                if (force) {
                    outf = fopenUTF8(outfile, "wb");
                }
            }

            if (outf) {
                result = ktxTexture1_CreateFromStdioStream(inf,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture);
                if (result != KTX_SUCCESS) {
                    if (result == KTX_UNKNOWN_FILE_FORMAT) {
                        cerr << infile << " is not a KTX v1 file." << endl;
                    } else if (result != KTX_SUCCESS) {
                        cerr << name
                             << " failed to create ktxTexture from " << infile
                             << ": " << ktxErrorString(result) << endl;
                    }
                    (void)fclose(inf);
                    (void)fclose(outf);
                    (void)unlinkUTF8(options.outfile.c_str());
                    exitCode = 2;
                    goto cleanup;
                }

                // Some in-the-wild KTX files have incorrect KTXOrientation
                // Warn about dropping invalid metadata.
                ktxHashListEntry* pEntry;
                for (pEntry = texture->kvDataHead;
                     pEntry != NULL;
                     pEntry = ktxHashList_Next(pEntry)) {
                    unsigned int keyLen;
                    char* key;

                    ktxHashListEntry_GetKey(pEntry, &keyLen, &key);
                    if (strncasecmp(key, "KTX", 3) == 0) {
                        if (strcmp(key, KTX_ORIENTATION_KEY)
                            && strcmp(key, KTX_WRITER_KEY)) {
                            if (strcmp(key, "KTXOrientation") == 0
                                && options.rewriteBadOrientation) {
                                    unsigned int orientLen;
                                    char* orientation;
                                    ktxHashListEntry_GetValue(pEntry,
                                                        &orientLen,
                                                        (void**)&orientation);
                                    ktxHashList_AddKVPair(&texture->kvDataHead,
                                                          KTX_ORIENTATION_KEY,
                                                          orientLen,
                                                          orientation);
                           } else {
                                cerr << name
                                     << ": Warning: Dropping unrecognized "
                                     << "metadata \"" << key << "\""
                                     << std::endl;
                            }
                            ktxHashList_DeleteEntry(&texture->kvDataHead,
                                                    pEntry);
                        }
                    }
                }

                // Add required writer metadata.
                std::stringstream writer;
                writeId(writer, options.test != 0);
                ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                      (ktx_uint32_t)writer.str().length() + 1,
                                      writer.str().c_str());

                result = ktxTexture1_WriteKTX2ToStdioStream(texture, outf);
                ktxTexture_Destroy(ktxTexture(texture));
                (void)fclose(inf);
                (void)fclose(outf);
                if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to write KTX2 file; "
                         << ktxErrorString(result) << endl;
                    (void)unlinkUTF8(options.outfile.c_str());
                    exitCode = 2;
                    goto cleanup;
                }
            } else {
                cerr << name
                     << " could not open output file \""
                     << (options.outfile.length() ? options.outfile.c_str()
                                                  : "stdout")
                     << "\". " << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") ? infile : "stdin") << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }

cleanup:
    return exitCode;
}